

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowDock(ImGuiWindow *window,ImGuiID dock_id,ImGuiCond cond)

{
  ImGuiID IVar1;
  ImGuiID *pIVar2;
  void *pvVar3;
  void *pvVar4;
  
  if ((cond == 0) || ((window->SetWindowDockAllowFlags & cond) != 0)) {
    *(byte *)&window->SetWindowDockAllowFlags = (byte)window->SetWindowDockAllowFlags & 0xf1;
    IVar1 = window->DockId;
    if (IVar1 != dock_id) {
      pvVar3 = ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,dock_id);
      if ((pvVar3 != (void *)0x0) && (*(long *)((long)pvVar3 + 0x18) != 0)) {
        do {
          pvVar4 = pvVar3;
          pvVar3 = *(void **)((long)pvVar4 + 0x10);
        } while (*(void **)((long)pvVar4 + 0x10) != (void *)0x0);
        pIVar2 = *(ImGuiID **)((long)pvVar4 + 0x90);
        if (pIVar2 == (ImGuiID *)0x0) {
          dock_id = *(ImGuiID *)((long)pvVar4 + 0xac);
        }
        else {
          if ((*(byte *)((long)pIVar2 + 9) & 8) == 0) {
            __assert_fail("new_node->CentralNode->IsCentralNode()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                          ,0x37af,"void ImGui::SetWindowDock(ImGuiWindow *, ImGuiID, ImGuiCond)");
          }
          dock_id = *pIVar2;
        }
      }
      if (IVar1 != dock_id) {
        if (window->DockNode != (ImGuiDockNode *)0x0) {
          DockNodeRemoveWindow(window->DockNode,window,0);
        }
        window->DockId = dock_id;
      }
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowDock(ImGuiWindow* window, ImGuiID dock_id, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowDockAllowFlags & cond) == 0)
        return;
    window->SetWindowDockAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    if (window->DockId == dock_id)
        return;

    // If the user attempt to set a dock id that is a split node, we'll dig within to find a suitable docking spot
    ImGuiContext* ctx = GImGui;
    if (ImGuiDockNode* new_node = DockContextFindNodeByID(ctx, dock_id))
        if (new_node->IsSplitNode())
        {
            // Policy: Find central node or latest focused node. We first move back to our root node.
            new_node = DockNodeGetRootNode(new_node);
            if (new_node->CentralNode)
            {
                IM_ASSERT(new_node->CentralNode->IsCentralNode());
                dock_id = new_node->CentralNode->ID;
            }
            else
            {
                dock_id = new_node->LastFocusedNodeId;
            }
        }

    if (window->DockId == dock_id)
        return;

    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, 0);
    window->DockId = dock_id;
}